

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

void RecalculateDrawnSubsectors(void)

{
  subsector_t *psVar1;
  uint local_1c;
  uint j;
  subsector_t *sub;
  int i;
  
  for (sub._4_4_ = 0; psVar1 = subsectors, sub._4_4_ < numsubsectors; sub._4_4_ = sub._4_4_ + 1) {
    for (local_1c = 0; local_1c < psVar1[sub._4_4_].numlines; local_1c = local_1c + 1) {
      if ((psVar1[sub._4_4_].firstline[local_1c].linedef != (line_t *)0x0) &&
         (((psVar1[sub._4_4_].firstline[local_1c].linedef)->flags & 0x100) != 0)) {
        psVar1[sub._4_4_].flags = psVar1[sub._4_4_].flags | 2;
      }
    }
  }
  return;
}

Assistant:

void RecalculateDrawnSubsectors()
{
	for(int i=0;i<numsubsectors;i++)
	{
		subsector_t *sub = &subsectors[i];
		for(unsigned int j=0;j<sub->numlines;j++)
		{
			if (sub->firstline[j].linedef != NULL && 
				(sub->firstline[j].linedef->flags & ML_MAPPED))
			{
				sub->flags |= SSECF_DRAWN;
			}
		}
	}
}